

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

void swrenderer::R_SetupSpanBits(FTexture *tex)

{
  byte bVar1;
  
  drawerargs::ds_xbits = (uint)tex->WidthBits;
  bVar1 = tex->HeightBits;
  drawerargs::ds_ybits = (uint)bVar1;
  if ((int)(uint)tex->Width < 1 << (tex->WidthBits & 0x1f)) {
    drawerargs::ds_xbits = drawerargs::ds_xbits - 1;
  }
  if ((int)(uint)tex->Height < 1 << (bVar1 & 0x1f)) {
    drawerargs::ds_ybits = bVar1 - 1;
  }
  return;
}

Assistant:

int GetWidth () { return Width; }